

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O2

void Opa_ManMoveOne(Opa_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pFanin)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Gia_Obj_t *pObj_00;
  int iVar7;
  long lVar8;
  Vec_Int_t *p_00;
  
  iVar4 = Gia_ObjId(p->pGia,pObj);
  iVar5 = Gia_ObjId(p->pGia,pFanin);
  if (iVar5 != 0) {
    piVar2 = p->pId2Part;
    iVar7 = piVar2[iVar4];
    lVar8 = (long)iVar7;
    if (lVar8 < 0) {
      __assert_fail("p->pId2Part[ iObj ] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCone.c"
                    ,0x88,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    iVar1 = piVar2[iVar5];
    if ((long)iVar1 == -1) {
      piVar2[iVar5] = iVar7;
      Vec_IntPush(p->pvParts + piVar2[iVar4],iVar5);
      uVar6 = (uint)*(undefined8 *)pFanin;
      if ((~uVar6 & 0x9fffffff) == 0) {
        iVar5 = Gia_ObjIsRo(p->pGia,pFanin);
        if (iVar5 == 0) {
          return;
        }
        pObj_00 = Gia_ObjRoToRi(p->pGia,pFanin);
        iVar5 = Gia_ObjId(p->pGia,pObj_00);
        piVar2 = p->pId2Part;
        if (piVar2[iVar5] != -1) {
          __assert_fail("p->pId2Part[ iFanin ] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCone.c"
                        ,0x94,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
        }
        iVar4 = piVar2[iVar4];
        piVar2[iVar5] = iVar4;
        Vec_IntPush(p->pvParts + iVar4,iVar5);
      }
      else if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCi(pFanin) || Gia_ObjIsAnd(pFanin)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCone.c"
                      ,0x8d,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vFront,iVar5);
      return;
    }
    if (iVar7 != iVar1) {
      pVVar3 = p->pvParts;
      iVar4 = pVVar3[lVar8].nSize;
      if (iVar4 < 1) {
        __assert_fail("Vec_IntSize(vPartObj) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCone.c"
                      ,0xa1,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
      }
      p_00 = pVVar3 + lVar8;
      for (iVar7 = 0; iVar7 < iVar4; iVar7 = iVar7 + 1) {
        iVar4 = Vec_IntEntry(p_00,iVar7);
        Vec_IntPush(pVVar3 + iVar1,iVar4);
        p->pId2Part[iVar4] = p->pId2Part[iVar5];
        iVar4 = p_00->nSize;
      }
      if (iVar4 < 0) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      p_00->nSize = 0;
      p->nParts = p->nParts + -1;
    }
  }
  return;
}

Assistant:

void Opa_ManMoveOne( Opa_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pFanin )
{
    int iObj   = Gia_ObjId(p->pGia, pObj);
    int iFanin = Gia_ObjId(p->pGia, pFanin);
    if ( iFanin == 0 )
        return;
    assert( p->pId2Part[ iObj ] >= 0 );
    if ( p->pId2Part[ iFanin ] == -1 )
    {
        p->pId2Part[ iFanin ] = p->pId2Part[ iObj ];
        Vec_IntPush( p->pvParts + p->pId2Part[ iObj ], iFanin );
        assert( Gia_ObjIsCi(pFanin) || Gia_ObjIsAnd(pFanin) );
        if ( Gia_ObjIsAnd(pFanin) )
            Vec_IntPush( p->vFront, iFanin );
        else if ( Gia_ObjIsRo(p->pGia, pFanin) )
        {
            pFanin = Gia_ObjRoToRi(p->pGia, pFanin);
            iFanin = Gia_ObjId(p->pGia, pFanin);
            assert( p->pId2Part[ iFanin ] == -1 );
            p->pId2Part[ iFanin ] = p->pId2Part[ iObj ];
            Vec_IntPush( p->pvParts + p->pId2Part[ iObj ], iFanin );
            Vec_IntPush( p->vFront, iFanin );
        }
    }
    else if ( p->pId2Part[ iObj ] != p->pId2Part[ iFanin ] )
    {
        Vec_Int_t * vPartObj = p->pvParts + p->pId2Part[ iObj ];
        Vec_Int_t * vPartFan = p->pvParts + p->pId2Part[ iFanin ];
        int iTemp, i;
//        printf( "Moving %d to %d (%d -> %d)\n", iObj, iFanin, Vec_IntSize(vPartObj), Vec_IntSize(vPartFan) );
        // add group of iObj to group of iFanin
        assert( Vec_IntSize(vPartObj) > 0 );
        Vec_IntForEachEntry( vPartObj, iTemp, i )
        {
            Vec_IntPush( vPartFan, iTemp );
            p->pId2Part[ iTemp ] = p->pId2Part[ iFanin ];
        }
        Vec_IntShrink( vPartObj, 0 );
        p->nParts--;
    }
}